

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall
icu_63::VTimeZone::writeFinalRule
          (VTimeZone *this,VTZWriter *writer,UBool isDst,AnnualTimeZoneRule *rule,
          int32_t fromRawOffset,int32_t fromDSTSavings,UDate startTime,UErrorCode *status)

{
  TimeRuleType TVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  DateRuleType DVar5;
  int32_t iVar6;
  int32_t iVar7;
  DateTimeRule *pDVar8;
  uint uVar9;
  VTZWriter *size;
  uint uVar10;
  bool bVar11;
  uint local_b0;
  ulong local_a8;
  UDate local_a0;
  uint local_94;
  UnicodeString name;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  size = writer;
  pDVar8 = AnnualTimeZoneRule::getRule(rule);
  TVar1 = DateTimeRule::getTimeRuleType(pDVar8);
  if (TVar1 == WALL_TIME) {
LAB_0020e2d0:
    pDVar8 = AnnualTimeZoneRule::getRule(rule);
    bVar11 = true;
  }
  else {
    iVar2 = DateTimeRule::getRuleMillisInDay(pDVar8);
    TVar1 = DateTimeRule::getTimeRuleType(pDVar8);
    if (TVar1 == UTC_TIME) {
      iVar4 = fromDSTSavings + fromRawOffset;
    }
    else {
      TVar1 = DateTimeRule::getTimeRuleType(pDVar8);
      iVar4 = 0;
      if (TVar1 == STANDARD_TIME) {
        iVar4 = fromDSTSavings;
      }
    }
    uVar10 = iVar4 + iVar2;
    if ((int)uVar10 < 0) {
      uVar10 = uVar10 + 86400000;
      local_94 = 0xffffffff;
LAB_0020e138:
      bVar11 = false;
    }
    else {
      if (86399999 < uVar10) {
        uVar10 = uVar10 + 0xfad9a400;
        local_94 = 1;
        goto LAB_0020e138;
      }
      local_94 = 0;
      bVar11 = true;
    }
    uVar3 = DateTimeRule::getRuleMonth(pDVar8);
    local_a8 = (ulong)uVar3;
    iVar4 = DateTimeRule::getRuleDayOfMonth(pDVar8);
    local_b0 = DateTimeRule::getRuleDayOfWeek(pDVar8);
    DVar5 = DateTimeRule::getDateRuleType(pDVar8);
    if (bVar11) {
      local_a8._0_4_ = uVar3;
      if (DVar5 == DOM) goto LAB_0020e25c;
LAB_0020e28e:
      pDVar8 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      if (pDVar8 == (DateTimeRule *)0x0) goto LAB_0020e2d0;
      DateTimeRule::DateTimeRule
                (pDVar8,(uint)local_a8,iVar4,local_b0,DVar5 == DOW_GEQ_DOM,uVar10,WALL_TIME);
    }
    else {
      if (DVar5 == DOW) {
        iVar2 = DateTimeRule::getRuleWeekInMonth(pDVar8);
        if (iVar2 < 1) {
          iVar4 = iVar2 * 7 + *(int *)(MONTHLENGTH + (long)(int)uVar3 * 4) + 7;
          DVar5 = DOW_LEQ_DOM;
        }
        else {
          iVar4 = iVar2 * 7 + -6;
          DVar5 = DOW_GEQ_DOM;
        }
      }
      size = (VTZWriter *)(ulong)local_94;
      iVar4 = iVar4 + local_94;
      if (iVar4 == 0) {
        local_a8 = 0xb;
        if (0 < (int)uVar3) {
          local_a8 = (ulong)(uVar3 - 1);
        }
        iVar4 = *(int *)(MONTHLENGTH + local_a8 * 4);
      }
      else if (*(int *)(MONTHLENGTH + (long)(int)uVar3 * 4) < iVar4) {
        uVar9 = 0;
        if ((int)uVar3 < 0xb) {
          uVar9 = uVar3 + 1;
        }
        iVar4 = 1;
        local_a8 = (ulong)uVar9;
      }
      if (DVar5 != DOM) {
        bVar11 = SCARRY4(local_b0,local_94);
        local_b0 = local_b0 + local_94;
        if (local_b0 == 0 || bVar11 != (int)local_b0 < 0) {
          local_b0 = 7;
        }
        else if (7 < local_b0) {
          local_b0 = 1;
        }
        goto LAB_0020e28e;
      }
LAB_0020e25c:
      pDVar8 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      if (pDVar8 == (DateTimeRule *)0x0) goto LAB_0020e2d0;
      DateTimeRule::DateTimeRule(pDVar8,(uint)local_a8,iVar4,uVar10,WALL_TIME);
    }
    bVar11 = false;
  }
  uVar10 = DateTimeRule::getRuleMillisInDay(pDVar8);
  if ((int)uVar10 < 0) {
    local_a0 = startTime + (double)(int)-uVar10;
  }
  else {
    local_a0 = startTime;
    if (86399999 < uVar10) {
      local_a0 = startTime - (double)(int)(uVar10 + 0xfad9a401);
    }
  }
  iVar2 = TimeZoneRule::getRawOffset(&rule->super_TimeZoneRule);
  iVar6 = TimeZoneRule::getDSTSavings(&rule->super_TimeZoneRule);
  name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003be258;
  name.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&rule->super_TimeZoneRule,&name);
  DVar5 = DateTimeRule::getDateRuleType(pDVar8);
  if (DVar5 < 4) {
    iVar4 = iVar6 + iVar2;
    switch(DVar5) {
    case DOM:
      iVar2 = DateTimeRule::getRuleMonth(pDVar8);
      iVar6 = DateTimeRule::getRuleDayOfMonth(pDVar8);
      writeZonePropsByDOM(this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar4,iVar2,iVar6,
                          local_a0,1.838821689216e+17,status);
      break;
    case DOW:
      iVar2 = DateTimeRule::getRuleMonth(pDVar8);
      iVar6 = DateTimeRule::getRuleWeekInMonth(pDVar8);
      iVar7 = DateTimeRule::getRuleDayOfWeek(pDVar8);
      writeZonePropsByDOW(this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar4,iVar2,iVar6,
                          iVar7,local_a0,1.838821689216e+17,status);
      break;
    case DOW_GEQ_DOM:
      iVar2 = DateTimeRule::getRuleMonth(pDVar8);
      iVar6 = DateTimeRule::getRuleDayOfMonth(pDVar8);
      iVar7 = DateTimeRule::getRuleDayOfWeek(pDVar8);
      writeZonePropsByDOW_GEQ_DOM
                (this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar4,iVar2,iVar6,iVar7,
                 local_a0,1.838821689216e+17,status);
      break;
    case DOW_LEQ_DOM:
      iVar2 = DateTimeRule::getRuleMonth(pDVar8);
      iVar6 = DateTimeRule::getRuleDayOfMonth(pDVar8);
      iVar7 = DateTimeRule::getRuleDayOfWeek(pDVar8);
      writeZonePropsByDOW_LEQ_DOM
                (this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar4,iVar2,iVar6,iVar7,
                 local_a0,1.838821689216e+17,status);
    }
  }
  if (!bVar11) {
    (*(pDVar8->super_UObject)._vptr_UObject[1])(pDVar8);
  }
  UnicodeString::~UnicodeString(&name);
  return;
}

Assistant:

void
VTimeZone::writeFinalRule(VTZWriter& writer, UBool isDst, const AnnualTimeZoneRule* rule,
                          int32_t fromRawOffset, int32_t fromDSTSavings,
                          UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    UBool modifiedRule = TRUE;
    const DateTimeRule *dtrule = toWallTimeRule(rule->getRule(), fromRawOffset, fromDSTSavings);
    if (dtrule == NULL) {
        modifiedRule = FALSE;
        dtrule = rule->getRule();
    }

    // If the rule's mills in a day is out of range, adjust start time.
    // Olson tzdata supports 24:00 of a day, but VTIMEZONE does not.
    // See ticket#7008/#7518

    int32_t timeInDay = dtrule->getRuleMillisInDay();
    if (timeInDay < 0) {
        startTime = startTime + (0 - timeInDay);
    } else if (timeInDay >= U_MILLIS_PER_DAY) {
        startTime = startTime - (timeInDay - (U_MILLIS_PER_DAY - 1));
    }

    int32_t toOffset = rule->getRawOffset() + rule->getDSTSavings();
    UnicodeString name;
    rule->getName(name);
    switch (dtrule->getDateRuleType()) {
    case DateTimeRule::DOM:
        writeZonePropsByDOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW:
        writeZonePropsByDOW(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleWeekInMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_GEQ_DOM:
        writeZonePropsByDOW_GEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_LEQ_DOM:
        writeZonePropsByDOW_LEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    }
    if (modifiedRule) {
        delete dtrule;
    }
}